

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBody.cpp
# Opt level: O0

void __thiscall btSoftBody::translate(btSoftBody *this,btVector3 *trs)

{
  btVector3 *in_RSI;
  btTransform t;
  btTransform *in_stack_ffffffffffffffb0;
  btTransform *in_stack_ffffffffffffffc0;
  
  btTransform::btTransform(in_stack_ffffffffffffffb0);
  btTransform::setIdentity(in_stack_ffffffffffffffc0);
  btTransform::setOrigin((btTransform *)&stack0xffffffffffffffb0,in_RSI);
  transform((btSoftBody *)t.m_origin.m_floats._8_8_,(btTransform *)t.m_origin.m_floats._0_8_);
  return;
}

Assistant:

void			btSoftBody::translate(const btVector3& trs)
{
	btTransform	t;
	t.setIdentity();
	t.setOrigin(trs);
	transform(t);
}